

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::ChatAt(VirtualMachine *this)

{
  char cVar1;
  Object *pOVar2;
  char *pcVar3;
  string *val;
  Variable VVar4;
  Variable VVar5;
  string *str;
  char c;
  size_t index;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar4 = popOpStack(this);
  VVar5 = popOpStack(this);
  if (VVar5.type == String) {
    if (VVar4.type == Integer) {
      pOVar2 = (Object *)std::__cxx11::string::size();
      if (VVar4.field_1.objectValue < pOVar2) {
        pcVar3 = (char *)std::__cxx11::string::at(VVar5.field_1.integerValue);
        cVar1 = *pcVar3;
        val = Heap::NewString_abi_cxx11_(&this->heap);
        std::__cxx11::string::clear();
        std::__cxx11::string::operator+=((string *)val,cVar1);
        pushString(this,val);
        advance(this);
      }
      else {
        pushUndefined(this);
        advance(this);
      }
    }
    else {
      pushUndefined(this);
      advance(this);
    }
  }
  else {
    pushUndefined(this);
    advance(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::ChatAt() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::Integer) {
    this->pushUndefined();
    this->advance();
    return;
  }

  std::size_t index = static_cast<std::size_t>(second.integerValue);

  if (index >= first.stringValue->size()) {
    this->pushUndefined();
    this->advance();
    return;
  }

  char c = first.stringValue->at(index);

  auto str = this->heap.NewString();

  str->clear();
  *str += c;

  this->pushString(str);
  this->advance();
}